

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIFileOpenDialog::~CGUIFileOpenDialog(CGUIFileOpenDialog *this,void **vtt)

{
  long *plVar1;
  long lVar2;
  u32 uVar3;
  undefined8 *in_RSI;
  IGUIFileOpenDialog *in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  (in_RDI->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver = (_func_int **)*in_RSI;
  *(undefined8 *)
   ((in_RDI->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
   (long)&(in_RDI->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver) = in_RSI[5];
  if (*(long *)&in_RDI[1].super_IGUIElement.ToolTipText.field_0x8 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI[1].super_IGUIElement.ToolTipText.field_0x10 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI[1].super_IGUIElement.ToolTipText.field_0x18 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI[1].super_IGUIElement.Name.str != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (in_RDI[1].super_IGUIElement.Name.str._M_string_length != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)((long)&in_RDI[1].super_IGUIElement.Name.str.field_2 + 8) != 0) {
    uVar3 = core::string<char>::size((string<char> *)0x3b7a75);
    if (uVar3 != 0) {
      plVar1 = *(long **)((long)&in_RDI[1].super_IGUIElement.Name.str.field_2 + 8);
      (**(code **)(*plVar1 + 0x90))(plVar1,&in_RDI[1].super_IGUIElement.MaxSize);
    }
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  lVar2._0_4_ = in_RDI[1].super_IGUIElement.ID;
  lVar2._4_1_ = in_RDI[1].super_IGUIElement.IsTabStop;
  lVar2._5_3_ = *(undefined3 *)&in_RDI[1].super_IGUIElement.field_0x10d;
  if (lVar2 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  core::string<char>::~string((string<char> *)0x3b7ae6);
  core::string<char>::~string((string<char> *)0x3b7af7);
  core::string<wchar_t>::~string((string<wchar_t> *)0x3b7b08);
  core::string<char>::~string((string<char> *)0x3b7b19);
  core::string<char>::~string((string<char> *)0x3b7b2a);
  core::string<wchar_t>::~string((string<wchar_t> *)0x3b7b3b);
  core::string<char>::~string((string<char> *)0x3b7b4c);
  IGUIFileOpenDialog::~IGUIFileOpenDialog
            (in_RDI,&in_stack_ffffffffffffffd8->_vptr_IReferenceCounted);
  return;
}

Assistant:

CGUIFileOpenDialog::~CGUIFileOpenDialog()
{
	if (CloseButton)
		CloseButton->drop();

	if (OKButton)
		OKButton->drop();

	if (CancelButton)
		CancelButton->drop();

	if (FileBox)
		FileBox->drop();

	if (FileNameText)
		FileNameText->drop();

	if (FileSystem) {
		// revert to original CWD if path was set in constructor
		if (RestoreDirectory.size())
			FileSystem->changeWorkingDirectoryTo(RestoreDirectory);
		FileSystem->drop();
	}

	if (FileList)
		FileList->drop();
}